

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.c
# Opt level: O1

HT_ErrorCode ht_timeline_set_feature(HT_Timeline *timeline,HT_Feature *feature)

{
  bool bVar1;
  ulong uVar2;
  HT_ErrorCode HVar3;
  
  if (feature == (HT_Feature *)0x0) {
    __assert_fail("feature",
                  "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/timeline.c"
                  ,0x7b,"HT_ErrorCode ht_timeline_set_feature(HT_Timeline *, HT_Feature *)");
  }
  if (feature->klass != (HT_FeatureKlass *)0x0) {
    uVar2 = (ulong)feature->klass->id;
    if (uVar2 < 0x20) {
      HVar3 = HT_ERR_OK;
      if (timeline->features[uVar2] == (HT_Feature *)0x0) {
        timeline->features[uVar2] = feature;
        bVar1 = true;
      }
      else {
        HVar3 = HT_ERR_FEATURE_ALREADY_REGISTERED;
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
      HVar3 = HT_ERR_FEATURE_NOT_REGISTERED;
    }
    if (!bVar1) {
      (*feature->klass->destroy)(feature);
    }
    return HVar3;
  }
  __assert_fail("feature->klass",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/timeline.c"
                ,0x7c,"HT_ErrorCode ht_timeline_set_feature(HT_Timeline *, HT_Feature *)");
}

Assistant:

HT_ErrorCode
ht_timeline_set_feature(HT_Timeline* timeline, HT_Feature* feature)
{
    assert(feature);
    assert(feature->klass);

    HT_ErrorCode error_code = HT_ERR_OK;

    if (feature->klass->id == HT_INVALID_FEATURE_ID || feature->klass->id >= HT_TIMELINE_MAX_FEATURES)
    {
        error_code = HT_ERR_FEATURE_NOT_REGISTERED;
    }
    else if (timeline->features[feature->klass->id])
    {
        error_code = HT_ERR_FEATURE_ALREADY_REGISTERED;
    }
    else
    {
        timeline->features[feature->klass->id] = feature;
    }

    if (error_code != HT_ERR_OK)
    {
        feature->klass->destroy(feature);
    }

    return error_code;
}